

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

Function * __thiscall soul::ModuleCloner::getRemappedFunction(ModuleCloner *this,Function *old)

{
  unordered_map<soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>,_std::hash<soul::pool_ref<const_soul::heart::Function>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Function>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>_>_>_>
  *this_00;
  mapped_type *this_01;
  Function *pFVar1;
  pool_ref<const_soul::heart::Function> local_20;
  Function *local_18;
  Function *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->functionMappings;
  local_18 = old;
  old_local = (Function *)this;
  pool_ref<soul::heart::Function_const>::pool_ref<soul::heart::Function,void>
            ((pool_ref<soul::heart::Function_const> *)&local_20,old);
  this_01 = std::
            unordered_map<soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>,_std::hash<soul::pool_ref<const_soul::heart::Function>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Function>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>_>_>_>
            ::operator[](this_00,(key_type *)&local_20);
  pFVar1 = pool_ptr<soul::heart::Function>::operator*(this_01);
  pool_ref<const_soul::heart::Function>::~pool_ref(&local_20);
  return pFVar1;
}

Assistant:

heart::Function& getRemappedFunction (heart::Function& old)                 { return *functionMappings[old]; }